

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

WirehairResult __thiscall wirehair::Codec::SolveMatrix(Codec *this)

{
  bool bVar1;
  Codec *in_RDI;
  Codec *unaff_retaddr;
  Codec *in_stack_00000020;
  Codec *in_stack_00000038;
  uint in_stack_00000064;
  uint in_stack_00000068;
  uint in_stack_0000006c;
  uint64_t *in_stack_00000070;
  Codec *in_stack_00000080;
  Codec *in_stack_000000d8;
  Codec *in_stack_000008e0;
  Codec *this_00;
  undefined4 local_4;
  
  this_00 = in_RDI;
  GreedyPeeling(in_stack_00000020);
  bVar1 = AllocateMatrix(in_stack_00000038);
  if (bVar1) {
    SetDeferredColumns(in_RDI);
    SetMixingColumnsForDeferredRows(in_RDI);
    PeelDiagonal(in_stack_00000080);
    CopyDeferredRows(unaff_retaddr);
    MultiplyDenseRows(in_stack_000008e0);
    SetHeavyRows(in_RDI);
    AddInvertibleGF2Matrix(in_stack_00000070,in_stack_0000006c,in_stack_00000068,in_stack_00000064);
    SetupTriangle(this_00);
    bVar1 = Triangle(in_stack_000000d8);
    if (bVar1) {
      local_4 = Wirehair_Success;
    }
    else {
      local_4 = Wirehair_NeedMore;
    }
  }
  else {
    local_4 = Wirehair_OOM;
  }
  return local_4;
}

Assistant:

WirehairResult Codec::SolveMatrix()
{
    // (1) Peeling

    GreedyPeeling();

    CAT_IF_DUMP( PrintPeeled(); )
    CAT_IF_DUMP( PrintDeferredRows(); )
    CAT_IF_DUMP( PrintDeferredColumns(); )

    // (2) Compression

    if (!AllocateMatrix()) {
        return Wirehair_OOM;
    }

    SetDeferredColumns();
    SetMixingColumnsForDeferredRows();
    PeelDiagonal();
    CopyDeferredRows();
    MultiplyDenseRows();
    SetHeavyRows();

    // Add invertible matrix to mathematically tie dense rows to dense mixing columns
    AddInvertibleGF2Matrix(_ge_matrix, _defer_count, _ge_pitch, _dense_count);

#if defined(CAT_DUMP_CODEC_DEBUG) || defined(CAT_DUMP_GE_MATRIX)
    cout << "After Compress:" << endl;
    PrintGEMatrix();
#endif
    CAT_IF_DUMP( PrintCompressMatrix(); )

    // (3) Gaussian Elimination

    SetupTriangle();

    if (!Triangle())
    {
        CAT_IF_DUMP( cout << "After Triangle FAILED:" << endl; )
        CAT_IF_DUMP( PrintGEMatrix(); )
        CAT_IF_DUMP( PrintExtraMatrix(); )

        return Wirehair_NeedMore;
    }

#if defined(CAT_DUMP_CODEC_DEBUG) || defined(CAT_DUMP_GE_MATRIX)
    cout << "After Triangle:" << endl;
    PrintGEMatrix();
    PrintExtraMatrix();
#endif

    return Wirehair_Success;
}